

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_1f2fc0e::Pipe::read(Pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  deque<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte bVar1;
  size_type sVar2;
  undefined4 in_register_00000034;
  void *pvVar3;
  void *pvVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex);
  this_00 = &this->data;
  pvVar3 = (void *)0x0;
LAB_00609386:
  do {
    bVar1 = this->closed;
    if ((bool)bVar1 == false) {
      sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      if (sVar2 == 0) {
        std::condition_variable::wait((unique_lock *)&this->cv);
        goto LAB_00609386;
      }
      bVar1 = this->closed;
    }
    pvVar4 = pvVar3;
    if ((bVar1 & 1) != 0) goto LAB_006093ec;
    while ((pvVar3 < __buf &&
           (sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00),
           sVar2 != 0))) {
      *(uchar *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3) =
           *(this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(this_00);
      pvVar3 = (void *)((long)pvVar3 + 1);
    }
    pvVar4 = __buf;
    if (__buf == pvVar3) {
LAB_006093ec:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return (ssize_t)pvVar4;
    }
  } while( true );
}

Assistant:

size_t read(void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    auto out = reinterpret_cast<uint8_t*>(buffer);
    size_t n = 0;
    while (true) {
      cv.wait(lock, [&] { return closed || data.size() > 0; });
      if (closed) {
        return n;
      }
      for (; n < bytes && data.size() > 0; n++) {
        out[n] = data.front();
        data.pop_front();
      }
      if (n == bytes) {
        return n;
      }
    }
  }